

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

stumpless_target * stumpless_open_function_target(char *name,stumpless_log_func_t log_function)

{
  stumpless_target *target_00;
  undefined8 *puVar1;
  function_target *function_target;
  stumpless_target *target;
  stumpless_log_func_t log_function_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else if (log_function == (stumpless_log_func_t)0x0) {
    raise_argument_empty("log_function was NULL");
  }
  else {
    target_00 = new_target(STUMPLESS_FUNCTION_TARGET,name);
    if (target_00 != (stumpless_target *)0x0) {
      puVar1 = (undefined8 *)alloc_mem(8);
      if (puVar1 != (undefined8 *)0x0) {
        *puVar1 = log_function;
        target_00->id = puVar1;
        stumpless_set_current_target(target_00);
        return target_00;
      }
      destroy_target(target_00);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_function_target( const char *name,
                                stumpless_log_func_t log_function ) {
  struct stumpless_target *target;
  struct function_target *function_target;

  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( log_function );

  target = new_target( STUMPLESS_FUNCTION_TARGET, name );
  if( !target ) {
   goto fail;
  }

  function_target = alloc_mem( sizeof( *function_target ) );
  if( !function_target ) {
    goto fail_id;
  }

  function_target->log_function = log_function;
  target->id = function_target;

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}